

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

precise_unit __thiscall
units::commoditizedUnit(units *this,string *unit_string,precise_unit actUnit,size_t *index)

{
  size_type __pos;
  void *__s;
  double dVar1;
  unit_data uVar2;
  int iVar3;
  uint32_t uVar4;
  void *pvVar5;
  size_type *psVar6;
  ulong uVar7;
  precise_unit pVar8;
  size_type ccindex;
  string commodStr;
  undefined8 local_98;
  double local_90;
  size_type local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  undefined8 local_40;
  undefined8 local_38;
  
  psVar6 = actUnit._8_8_;
  dVar1 = actUnit.multiplier_;
  local_98 = unit_string;
  local_90 = dVar1;
  if (*(size_t *)(this + 8) == 0) {
    uVar7 = 0xffffffffffffffff;
  }
  else {
    __s = *(void **)this;
    pvVar5 = memchr(__s,0x7b,*(size_t *)(this + 8));
    uVar7 = -(ulong)(pvVar5 == (void *)0x0) | (long)pvVar5 - (long)__s;
  }
  if (uVar7 != 0xffffffffffffffff) {
    __pos = uVar7 + 1;
    local_88 = __pos;
    segmentcheck((string *)this,'}',&local_88);
    if ((local_88 - __pos == 2) && (*(char *)(*(long *)this + __pos) == '#')) {
      *psVar6 = local_88;
      uVar2 = detail::unit_data::operator*((unit_data *)&local_98,(unit_data *)((long)&count + 4));
      unit_string = (string *)CONCAT44(local_98._4_4_,uVar2);
    }
    else {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
                 ,__pos,(local_88 - uVar7) - 2);
      iVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_80,"cells");
      if (iVar3 == 0) {
        *psVar6 = local_88;
        local_40 = 0x3ff0000000000000;
        local_38 = 0x604335a004000000;
        local_90 = dVar1;
        uVar2 = detail::unit_data::operator*((unit_data *)&local_98,(unit_data *)&local_38);
        unit_string = (string *)CONCAT44(local_38._4_4_ | local_98._4_4_,uVar2);
      }
      else {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p == &local_80.field_2) {
          local_60.field_2._8_8_ = local_80.field_2._8_8_;
          local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        }
        else {
          local_60._M_dataplus._M_p = local_80._M_dataplus._M_p;
        }
        local_60.field_2._M_allocated_capacity._1_7_ = local_80.field_2._M_allocated_capacity._1_7_;
        local_60.field_2._M_local_buf[0] = local_80.field_2._M_local_buf[0];
        local_60._M_string_length = local_80._M_string_length;
        local_80._M_string_length = 0;
        local_80.field_2._M_local_buf[0] = '\0';
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        uVar4 = getCommodity(&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        *psVar6 = local_88;
        unit_string = (string *)CONCAT44(uVar4 | local_98._4_4_,local_98._0_4_);
        local_90 = dVar1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,
                        CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                                 local_80.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  pVar8._8_8_ = unit_string;
  pVar8.multiplier_ = local_90;
  return pVar8;
}

Assistant:

static precise_unit commoditizedUnit(
    const std::string& unit_string,
    precise_unit actUnit,
    size_t& index)
{
    auto ccindex = unit_string.find_first_of('{');
    if (ccindex == std::string::npos) {
        return actUnit;
    }
    ++ccindex;
    auto start = ccindex;
    segmentcheck(unit_string, '}', ccindex);
    if (ccindex - start == 2) {
        // there are a couple units that might look like commodities
        if (unit_string[start] == '#') {
            index = ccindex;
            return actUnit * count;
        }
    }
    std::string commodStr = unit_string.substr(start, ccindex - start - 1);
    if (commodStr == "cells") {
        index = ccindex;
        return actUnit * precise_unit(1.0, precise::count, commodities::cell);
    }
    auto hcode = getCommodity(std::move(commodStr));
    index = ccindex;
    return {1.0, actUnit, hcode};
}